

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

double __thiscall presolve::HPresolve::getMaxAbsRowVal(HPresolve *this,HighsInt row)

{
  int node;
  iterator __begin1;
  double local_50;
  iterator local_48;
  
  node = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[row];
  if (node == -1) {
    local_48.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.nodeLeft = (HighsInt *)0x0;
    local_48.nodeRight = (HighsInt *)0x0;
    local_48.pos_.index_ = (HighsInt *)0x0;
    local_48.pos_.value_ = (double *)0x0;
    local_48.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.currentNode = -1;
  }
  else {
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::iterator
              (&local_48,
               (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,node);
  }
  local_50 = 0.0;
  while (local_48.currentNode != -1) {
    if (local_50 <= ABS(*local_48.pos_.value_)) {
      local_50 = ABS(*local_48.pos_.value_);
    }
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&local_48);
  }
  if (local_48.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_50;
}

Assistant:

HighsTripletTreeSlicePreOrder HPresolve::getRowVector(HighsInt row) const {
  return HighsTripletTreeSlicePreOrder(
      Acol.data(), Avalue.data(), ARleft.data(), ARright.data(), rowroot[row]);
}